

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O1

shared_ptr<helics::apps::App>
anon_unknown.dwarf_112552::buildApp(string_view type,string_view appName,FederateInfo *fedInfo)

{
  char *pcVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char *__n;
  element_type *peVar4;
  FederateInfo *in_R9;
  size_type __rlen;
  shared_ptr<helics::apps::App> sVar5;
  undefined1 local_49;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  __n = type._M_str;
  peVar4 = (element_type *)type._M_len;
  local_38._M_len = (size_t)appName._M_str;
  __s1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)appName._M_len;
  pcVar1 = __n + -4;
  _Var3._M_pi = __s1;
  local_38._M_str = (char *)fedInfo;
  switch(pcVar1) {
  case (char *)0x0:
switchD_001b7521_caseD_0:
    iVar2 = bcmp(__s1,"echo",(size_t)__n);
    if (iVar2 == 0) {
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Echo,std::allocator<helics::apps::Echo>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Echo **)&local_48,(allocator<helics::apps::Echo> *)&local_49,&local_38,
                 in_R9);
      _Var3._M_pi = extraout_RDX_08;
      goto LAB_001b77be;
    }
    if (__n == (char *)0x6) goto switchD_001b75bc_caseD_2;
    _Var3._M_pi = extraout_RDX;
    if (__n == (char *)0x5) goto switchD_001b7521_caseD_1;
    break;
  case (char *)0x1:
switchD_001b7521_caseD_1:
    iVar2 = bcmp(__s1,"clone",(size_t)__n);
    if (iVar2 == 0) {
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Clone,std::allocator<helics::apps::Clone>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Clone **)&local_48,(allocator<helics::apps::Clone> *)&local_49,
                 &local_38,in_R9);
      _Var3._M_pi = extraout_RDX_07;
    }
    else if (__n == (char *)0x6) {
switchD_001b75bc_caseD_2:
      iVar2 = bcmp(__s1,"tracer",(size_t)__n);
      if (iVar2 == 0) {
        local_48 = (Recorder *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<helics::apps::Tracer,std::allocator<helics::apps::Tracer>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&_Stack_40,(Tracer **)&local_48,(allocator<helics::apps::Tracer> *)&local_49,
                   &local_38,in_R9);
        _Var3._M_pi = extraout_RDX_10;
      }
      else {
        _Var3._M_pi = extraout_RDX_05;
        if ((__n != (char *)0x6) ||
           (iVar2 = bcmp(__s1,"source",6), _Var3._M_pi = extraout_RDX_06, iVar2 != 0)) break;
        local_48 = (Recorder *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<helics::apps::Source,std::allocator<helics::apps::Source>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&_Stack_40,(Source **)&local_48,(allocator<helics::apps::Source> *)&local_49,
                   &local_38,in_R9);
        _Var3._M_pi = extraout_RDX_13;
      }
    }
    else {
      _Var3._M_pi = extraout_RDX_03;
      if ((__n != (char *)0x5) ||
         (iVar2 = bcmp(__s1,"probe",5), _Var3._M_pi = extraout_RDX_04, iVar2 != 0)) break;
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Probe,std::allocator<helics::apps::Probe>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Probe **)&local_48,(allocator<helics::apps::Probe> *)&local_49,
                 &local_38,in_R9);
      _Var3._M_pi = extraout_RDX_14;
    }
LAB_001b77be:
    (peVar4->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    goto LAB_001b77ca;
  case (char *)0x2:
    iVar2 = bcmp(__s1,"player",(size_t)__n);
    if (iVar2 == 0) {
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Player,std::allocator<helics::apps::Player>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Player **)&local_48,(allocator<helics::apps::Player> *)&local_49,
                 &local_38,in_R9);
      _Var3._M_pi = extraout_RDX_12;
      goto LAB_001b77be;
    }
    _Var3._M_pi = extraout_RDX_00;
    switch(pcVar1) {
    case (char *)0x0:
      goto switchD_001b7521_caseD_0;
    case (char *)0x1:
      goto switchD_001b7521_caseD_1;
    case (char *)0x2:
      goto switchD_001b75bc_caseD_2;
    case (char *)0x4:
      goto switchD_001b7521_caseD_4;
    case (char *)0x5:
      goto switchD_001b7521_caseD_5;
    }
    break;
  case (char *)0x4:
switchD_001b7521_caseD_4:
    iVar2 = bcmp(__s1,"recorder",(size_t)__n);
    if (iVar2 == 0) {
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Recorder,std::allocator<helics::apps::Recorder>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Recorder **)&local_48,(allocator<helics::apps::Recorder> *)&local_49,
                 &local_38,in_R9);
      _Var3._M_pi = extraout_RDX_11;
      goto LAB_001b77be;
    }
    _Var3._M_pi = extraout_RDX_01;
    switch(pcVar1) {
    case (char *)0x0:
      goto switchD_001b7521_caseD_0;
    case (char *)0x1:
      goto switchD_001b7521_caseD_1;
    case (char *)0x2:
      goto switchD_001b75bc_caseD_2;
    case (char *)0x5:
      goto switchD_001b7521_caseD_5;
    }
    break;
  case (char *)0x5:
switchD_001b7521_caseD_5:
    iVar2 = bcmp(__s1,"connector",(size_t)__n);
    if (iVar2 == 0) {
      local_48 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Connector,std::allocator<helics::apps::Connector>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_40,(Connector **)&local_48,(allocator<helics::apps::Connector> *)&local_49,
                 &local_38,in_R9);
      _Var3._M_pi = extraout_RDX_09;
      goto LAB_001b77be;
    }
    if (__n == (char *)0x6) goto switchD_001b75bc_caseD_2;
    if (__n == (char *)0x5) goto switchD_001b7521_caseD_1;
    _Var3._M_pi = extraout_RDX_02;
    if (__n == (char *)0x4) goto switchD_001b7521_caseD_0;
  }
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  _Stack_40._M_pi._0_4_ = 0;
  _Stack_40._M_pi._4_4_ = 0;
LAB_001b77ca:
  *(undefined4 *)&peVar4->_vptr_App = (undefined4)local_48;
  *(undefined4 *)((long)&peVar4->_vptr_App + 4) = local_48._4_4_;
  *(undefined4 *)
   &(peVar4->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = _Stack_40._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(peVar4->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 4) = _Stack_40._M_pi._4_4_;
  sVar5.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  return (shared_ptr<helics::apps::App>)
         sVar5.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::apps::App> buildApp(std::string_view type, std::string_view appName, helics::FederateInfo& fedInfo)
{
    if (type == "player") {
        return std::make_shared<helics::apps::Player>(appName, fedInfo);
    }
    if (type == "recorder") {
        return std::make_shared<helics::apps::Recorder>(appName, fedInfo);
    }
    if (type == "connector") {
        return std::make_shared<helics::apps::Connector>(appName, fedInfo);
    }
    if (type == "echo") {
        return std::make_shared<helics::apps::Echo>(appName, fedInfo);
    }
    if (type == "clone") {
        return std::make_shared<helics::apps::Clone>(appName, fedInfo);
    }
    if (type == "probe") {
        return std::make_shared<helics::apps::Probe>(appName, fedInfo);
    }
    if (type == "tracer") {
        return std::make_shared<helics::apps::Tracer>(appName, fedInfo);
    }
    if (type == "source") {
        return std::make_shared<helics::apps::Source>(appName, fedInfo);
    }
    return nullptr;
}